

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat_tests.cpp
# Opt level: O3

void __thiscall
iu_ConcatTestCheck_x_iutest_x_A_Test::Body(iu_ConcatTestCheck_x_iutest_x_A_Test *this)

{
  ConcatTestCheckCount("A1/ConcatTest",4);
  ConcatTestCheckCount("A2/ConcatTest",4);
  ConcatTestCheckCount("A3/ConcatTest",0xb);
  ConcatTestCheckCount("A4/ConcatTest",0xd);
  ConcatTestCheckCount("A5/ConcatTest",0xb);
  ConcatTestCheckCount("A6/ConcatTest",3);
  return;
}

Assistant:

IUTEST(ConcatTestCheck, A)
{
    ConcatTestCheckCount("A1/ConcatTest", 2+2);
    ConcatTestCheckCount("A2/ConcatTest", 2+2);
    ConcatTestCheckCount("A3/ConcatTest", 2+9);
    ConcatTestCheckCount("A4/ConcatTest", 2+2+9);
    ConcatTestCheckCount("A5/ConcatTest", 2+9);
#if IUTEST_HAS_RANDOMVALUES
    ConcatTestCheckCount("A6/ConcatTest", 2+1);
#endif
}